

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O0

REF_STATUS ref_clump_between_export_to(REF_GRID ref_grid,REF_INT node0,REF_INT node1,char *filename)

{
  uint uVar1;
  REF_INT local_1dc;
  REF_INT local_1d8;
  int local_1d4;
  REF_INT local_1d0;
  REF_INT local_1cc;
  int local_1c8;
  REF_INT local_1c4;
  REF_INT local_1c0;
  int local_1bc;
  REF_INT local_1b8;
  REF_INT local_1b4;
  int local_1b0;
  REF_INT local_1ac;
  REF_INT local_1a8;
  REF_INT local_1a4;
  REF_INT local_1a0;
  int local_19c;
  REF_INT local_198;
  REF_INT local_194;
  int local_190;
  REF_INT local_18c;
  REF_INT local_188;
  int local_184;
  REF_INT local_180;
  REF_INT local_17c;
  int local_178;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rxs_3;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DICT node_dict;
  REF_INT nodes [27];
  int local_70;
  int local_6c;
  REF_INT ixyz;
  REF_INT new_node;
  REF_INT new_cell;
  REF_INT index;
  REF_INT old;
  REF_INT cell_node;
  REF_INT cell;
  REF_INT item;
  REF_CELL loc_cell;
  REF_CELL ref_cell;
  REF_NODE loc_node;
  REF_NODE ref_node;
  REF_GRID loc_grid;
  char *filename_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  loc_grid = (REF_GRID)filename;
  filename_local._0_4_ = node1;
  filename_local._4_4_ = node0;
  _node1_local = ref_grid;
  uVar1 = ref_grid_create((REF_GRID *)&ref_node,ref_grid->mpi);
  if (uVar1 == 0) {
    uVar1 = ref_dict_create((REF_DICT *)&ref_private_macro_code_rss_1);
    if (uVar1 == 0) {
      loc_cell = _node1_local->cell[3];
      if ((filename_local._4_4_ < 0) || (loc_cell->ref_adj->nnode <= filename_local._4_4_)) {
        local_178 = -1;
      }
      else {
        local_178 = loc_cell->ref_adj->first[filename_local._4_4_];
      }
      cell_node = local_178;
      if (local_178 == -1) {
        local_17c = -1;
      }
      else {
        local_17c = loc_cell->ref_adj->item[local_178].ref;
      }
      old = local_17c;
      while (cell_node != -1) {
        uVar1 = ref_cell_nodes(loc_cell,old,(REF_INT *)&node_dict);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x113,"ref_clump_between_export_to",(ulong)uVar1,"n");
          return uVar1;
        }
        for (index = 0; index < loc_cell->node_per; index = index + 1) {
          uVar1 = ref_dict_store(_ref_private_macro_code_rss_1,nodes[(long)index + -2],0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x115,"ref_clump_between_export_to",(ulong)uVar1,"store");
            return uVar1;
          }
        }
        cell_node = loc_cell->ref_adj->item[cell_node].next;
        if (cell_node == -1) {
          local_180 = -1;
        }
        else {
          local_180 = loc_cell->ref_adj->item[cell_node].ref;
        }
        old = local_180;
      }
      if (((REF_INT)filename_local < 0) || (loc_cell->ref_adj->nnode <= (REF_INT)filename_local)) {
        local_184 = -1;
      }
      else {
        local_184 = loc_cell->ref_adj->first[(REF_INT)filename_local];
      }
      cell_node = local_184;
      if (local_184 == -1) {
        local_188 = -1;
      }
      else {
        local_188 = loc_cell->ref_adj->item[local_184].ref;
      }
      old = local_188;
      while (cell_node != -1) {
        uVar1 = ref_cell_nodes(loc_cell,old,(REF_INT *)&node_dict);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x118,"ref_clump_between_export_to",(ulong)uVar1,"n");
          return uVar1;
        }
        for (index = 0; index < loc_cell->node_per; index = index + 1) {
          uVar1 = ref_dict_store(_ref_private_macro_code_rss_1,nodes[(long)index + -2],0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x11a,"ref_clump_between_export_to",(ulong)uVar1,"store");
            return uVar1;
          }
        }
        cell_node = loc_cell->ref_adj->item[cell_node].next;
        if (cell_node == -1) {
          local_18c = -1;
        }
        else {
          local_18c = loc_cell->ref_adj->item[cell_node].ref;
        }
        old = local_18c;
      }
      loc_cell = _node1_local->cell[8];
      if ((filename_local._4_4_ < 0) || (loc_cell->ref_adj->nnode <= filename_local._4_4_)) {
        local_190 = -1;
      }
      else {
        local_190 = loc_cell->ref_adj->first[filename_local._4_4_];
      }
      cell_node = local_190;
      if (local_190 == -1) {
        local_194 = -1;
      }
      else {
        local_194 = loc_cell->ref_adj->item[local_190].ref;
      }
      old = local_194;
      while (cell_node != -1) {
        uVar1 = ref_cell_nodes(loc_cell,old,(REF_INT *)&node_dict);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x11f,"ref_clump_between_export_to",(ulong)uVar1,"n");
          return uVar1;
        }
        for (index = 0; index < loc_cell->node_per; index = index + 1) {
          uVar1 = ref_dict_store(_ref_private_macro_code_rss_1,nodes[(long)index + -2],0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x121,"ref_clump_between_export_to",(ulong)uVar1,"store");
            return uVar1;
          }
        }
        cell_node = loc_cell->ref_adj->item[cell_node].next;
        if (cell_node == -1) {
          local_198 = -1;
        }
        else {
          local_198 = loc_cell->ref_adj->item[cell_node].ref;
        }
        old = local_198;
      }
      if (((REF_INT)filename_local < 0) || (loc_cell->ref_adj->nnode <= (REF_INT)filename_local)) {
        local_19c = -1;
      }
      else {
        local_19c = loc_cell->ref_adj->first[(REF_INT)filename_local];
      }
      cell_node = local_19c;
      if (local_19c == -1) {
        local_1a0 = -1;
      }
      else {
        local_1a0 = loc_cell->ref_adj->item[local_19c].ref;
      }
      old = local_1a0;
      while (cell_node != -1) {
        uVar1 = ref_cell_nodes(loc_cell,old,(REF_INT *)&node_dict);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x124,"ref_clump_between_export_to",(ulong)uVar1,"n");
          return uVar1;
        }
        for (index = 0; index < loc_cell->node_per; index = index + 1) {
          uVar1 = ref_dict_store(_ref_private_macro_code_rss_1,nodes[(long)index + -2],0);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x126,"ref_clump_between_export_to",(ulong)uVar1,"store");
            return uVar1;
          }
        }
        cell_node = loc_cell->ref_adj->item[cell_node].next;
        if (cell_node == -1) {
          local_1a4 = -1;
        }
        else {
          local_1a4 = loc_cell->ref_adj->item[cell_node].ref;
        }
        old = local_1a4;
      }
      loc_node = _node1_local->node;
      ref_cell = *(REF_CELL *)&ref_node->blank;
      new_node = 0;
      if (_ref_private_macro_code_rss_1->n < 1) {
        local_1a8 = -1;
      }
      else {
        local_1a8 = *_ref_private_macro_code_rss_1->key;
      }
      new_cell = local_1a8;
      while (new_node < _ref_private_macro_code_rss_1->n) {
        uVar1 = ref_node_add((REF_NODE)ref_cell,(long)new_node,&local_6c);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 300,"ref_clump_between_export_to",(ulong)uVar1,"new_node");
          return uVar1;
        }
        for (local_70 = 0; local_70 < 3; local_70 = local_70 + 1) {
          *(REF_DBL *)(ref_cell->c2n + (long)(local_70 + local_6c * 0xf) * 2) =
               loc_node->real[local_70 + new_cell * 0xf];
        }
        new_node = new_node + 1;
        if ((new_node < 0) || (_ref_private_macro_code_rss_1->n <= new_node)) {
          local_1ac = -1;
        }
        else {
          local_1ac = _ref_private_macro_code_rss_1->key[new_node];
        }
        new_cell = local_1ac;
      }
      uVar1 = ref_node_initialize_n_global
                        ((REF_NODE)ref_cell,(long)_ref_private_macro_code_rss_1->n);
      if (uVar1 == 0) {
        loc_cell = _node1_local->cell[8];
        _cell = (REF_CELL)ref_node->ref_mpi;
        if ((filename_local._4_4_ < 0) || (loc_cell->ref_adj->nnode <= filename_local._4_4_)) {
          local_1b0 = -1;
        }
        else {
          local_1b0 = loc_cell->ref_adj->first[filename_local._4_4_];
        }
        cell_node = local_1b0;
        if (local_1b0 == -1) {
          local_1b4 = -1;
        }
        else {
          local_1b4 = loc_cell->ref_adj->item[local_1b0].ref;
        }
        old = local_1b4;
        while (cell_node != -1) {
          uVar1 = ref_cell_nodes(loc_cell,old,(REF_INT *)&node_dict);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x138,"ref_clump_between_export_to",(ulong)uVar1,"n");
            return uVar1;
          }
          for (index = 0; index < loc_cell->node_per; index = index + 1) {
            new_cell = nodes[(long)index + -2];
            uVar1 = ref_dict_location(_ref_private_macro_code_rss_1,new_cell,
                                      nodes + (long)index + -2);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x13b,"ref_clump_between_export_to",(ulong)uVar1,"map");
              return uVar1;
            }
          }
          uVar1 = ref_cell_with(_cell,(REF_INT *)&node_dict,&ixyz);
          if ((uVar1 != 0) && (uVar1 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x13d,"ref_clump_between_export_to",(ulong)uVar1,"exists?");
            return uVar1;
          }
          if ((ixyz == -1) && (uVar1 = ref_cell_add(_cell,(REF_INT *)&node_dict,&ixyz), uVar1 != 0))
          {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x13f,"ref_clump_between_export_to",(ulong)uVar1,"new cell");
            return uVar1;
          }
          cell_node = loc_cell->ref_adj->item[cell_node].next;
          if (cell_node == -1) {
            local_1b8 = -1;
          }
          else {
            local_1b8 = loc_cell->ref_adj->item[cell_node].ref;
          }
          old = local_1b8;
        }
        if (((REF_INT)filename_local < 0) || (loc_cell->ref_adj->nnode <= (REF_INT)filename_local))
        {
          local_1bc = -1;
        }
        else {
          local_1bc = loc_cell->ref_adj->first[(REF_INT)filename_local];
        }
        cell_node = local_1bc;
        if (local_1bc == -1) {
          local_1c0 = -1;
        }
        else {
          local_1c0 = loc_cell->ref_adj->item[local_1bc].ref;
        }
        old = local_1c0;
        while (cell_node != -1) {
          uVar1 = ref_cell_nodes(loc_cell,old,(REF_INT *)&node_dict);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x143,"ref_clump_between_export_to",(ulong)uVar1,"n");
            return uVar1;
          }
          for (index = 0; index < loc_cell->node_per; index = index + 1) {
            new_cell = nodes[(long)index + -2];
            uVar1 = ref_dict_location(_ref_private_macro_code_rss_1,new_cell,
                                      nodes + (long)index + -2);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x146,"ref_clump_between_export_to",(ulong)uVar1,"map");
              return uVar1;
            }
          }
          uVar1 = ref_cell_with(_cell,(REF_INT *)&node_dict,&ixyz);
          if ((uVar1 != 0) && (uVar1 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x148,"ref_clump_between_export_to",(ulong)uVar1,"exists?");
            return uVar1;
          }
          if ((ixyz == -1) && (uVar1 = ref_cell_add(_cell,(REF_INT *)&node_dict,&ixyz), uVar1 != 0))
          {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x14a,"ref_clump_between_export_to",(ulong)uVar1,"new cell");
            return uVar1;
          }
          cell_node = loc_cell->ref_adj->item[cell_node].next;
          if (cell_node == -1) {
            local_1c4 = -1;
          }
          else {
            local_1c4 = loc_cell->ref_adj->item[cell_node].ref;
          }
          old = local_1c4;
        }
        loc_cell = _node1_local->cell[3];
        _cell = (REF_CELL)ref_node->part;
        if ((filename_local._4_4_ < 0) || (loc_cell->ref_adj->nnode <= filename_local._4_4_)) {
          local_1c8 = -1;
        }
        else {
          local_1c8 = loc_cell->ref_adj->first[filename_local._4_4_];
        }
        cell_node = local_1c8;
        if (local_1c8 == -1) {
          local_1cc = -1;
        }
        else {
          local_1cc = loc_cell->ref_adj->item[local_1c8].ref;
        }
        old = local_1cc;
        while (cell_node != -1) {
          uVar1 = ref_cell_nodes(loc_cell,old,(REF_INT *)&node_dict);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x151,"ref_clump_between_export_to",(ulong)uVar1,"n");
            return uVar1;
          }
          for (index = 0; index < loc_cell->node_per; index = index + 1) {
            new_cell = nodes[(long)index + -2];
            uVar1 = ref_dict_location(_ref_private_macro_code_rss_1,new_cell,
                                      nodes + (long)index + -2);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x154,"ref_clump_between_export_to",(ulong)uVar1,"map");
              return uVar1;
            }
          }
          uVar1 = ref_cell_with(_cell,(REF_INT *)&node_dict,&ixyz);
          if ((uVar1 != 0) && (uVar1 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x156,"ref_clump_between_export_to",(ulong)uVar1,"exists?");
            return uVar1;
          }
          if ((ixyz == -1) && (uVar1 = ref_cell_add(_cell,(REF_INT *)&node_dict,&ixyz), uVar1 != 0))
          {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x158,"ref_clump_between_export_to",(ulong)uVar1,"new cell");
            return uVar1;
          }
          cell_node = loc_cell->ref_adj->item[cell_node].next;
          if (cell_node == -1) {
            local_1d0 = -1;
          }
          else {
            local_1d0 = loc_cell->ref_adj->item[cell_node].ref;
          }
          old = local_1d0;
        }
        if (((REF_INT)filename_local < 0) || (loc_cell->ref_adj->nnode <= (REF_INT)filename_local))
        {
          local_1d4 = -1;
        }
        else {
          local_1d4 = loc_cell->ref_adj->first[(REF_INT)filename_local];
        }
        cell_node = local_1d4;
        if (local_1d4 == -1) {
          local_1d8 = -1;
        }
        else {
          local_1d8 = loc_cell->ref_adj->item[local_1d4].ref;
        }
        old = local_1d8;
        while (cell_node != -1) {
          uVar1 = ref_cell_nodes(loc_cell,old,(REF_INT *)&node_dict);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x15c,"ref_clump_between_export_to",(ulong)uVar1,"n");
            return uVar1;
          }
          for (index = 0; index < loc_cell->node_per; index = index + 1) {
            new_cell = nodes[(long)index + -2];
            uVar1 = ref_dict_location(_ref_private_macro_code_rss_1,new_cell,
                                      nodes + (long)index + -2);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x15f,"ref_clump_between_export_to",(ulong)uVar1,"map");
              return uVar1;
            }
          }
          uVar1 = ref_cell_with(_cell,(REF_INT *)&node_dict,&ixyz);
          if ((uVar1 != 0) && (uVar1 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x161,"ref_clump_between_export_to",(ulong)uVar1,"exists?");
            return uVar1;
          }
          if ((ixyz == -1) && (uVar1 = ref_cell_add(_cell,(REF_INT *)&node_dict,&ixyz), uVar1 != 0))
          {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x163,"ref_clump_between_export_to",(ulong)uVar1,"new cell");
            return uVar1;
          }
          cell_node = loc_cell->ref_adj->item[cell_node].next;
          if (cell_node == -1) {
            local_1dc = -1;
          }
          else {
            local_1dc = loc_cell->ref_adj->item[cell_node].ref;
          }
          old = local_1dc;
        }
        uVar1 = ref_dict_location(_ref_private_macro_code_rss_1,filename_local._4_4_,
                                  (REF_INT *)&node_dict);
        if (uVar1 == 0) {
          uVar1 = ref_dict_location(_ref_private_macro_code_rss_1,(REF_INT)filename_local,
                                    (REF_INT *)((long)&node_dict + 4));
          if (uVar1 == 0) {
            printf("node0 %d node1 %d\n",(ulong)(uint)node_dict,(ulong)node_dict._4_4_);
            uVar1 = ref_dict_free(_ref_private_macro_code_rss_1);
            if (uVar1 == 0) {
              uVar1 = ref_export_by_extension((REF_GRID)ref_node,(char *)loc_grid);
              if (uVar1 == 0) {
                ref_grid_local._4_4_ = ref_grid_free((REF_GRID)ref_node);
                if (ref_grid_local._4_4_ == 0) {
                  ref_grid_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                         ,0x16f,"ref_clump_between_export_to",(ulong)ref_grid_local._4_4_,
                         "free loc grid");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                       ,0x16d,"ref_clump_between_export_to",(ulong)uVar1,"dump");
                ref_grid_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x16b,"ref_clump_between_export_to",(ulong)uVar1,"free nodes");
              ref_grid_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0x168,"ref_clump_between_export_to",(ulong)uVar1,"map1");
            ref_grid_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x167,"ref_clump_between_export_to",(ulong)uVar1,"map0");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x133,"ref_clump_between_export_to",(ulong)uVar1,"init glob");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x10f
             ,"ref_clump_between_export_to",(ulong)uVar1,"create nodes");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0x10d,
           "ref_clump_between_export_to",(ulong)uVar1,"create grid");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_clump_between_export_to(REF_GRID ref_grid, REF_INT node0,
                                               REF_INT node1,
                                               const char *filename) {
  REF_GRID loc_grid;
  REF_NODE ref_node, loc_node;
  REF_CELL ref_cell, loc_cell;
  REF_INT item, cell, cell_node;
  REF_INT old, index, new_cell, new_node, ixyz;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DICT node_dict;

  RSS(ref_grid_create(&loc_grid, ref_grid_mpi(ref_grid)), "create grid");

  RSS(ref_dict_create(&node_dict), "create nodes");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  ref_node = ref_grid_node(ref_grid);
  loc_node = ref_grid_node(loc_grid);
  each_ref_dict_key(node_dict, index, old) {
    RSS(ref_node_add(loc_node, index, &new_node), "new_node");
    for (ixyz = 0; ixyz < 3; ixyz++) {
      ref_node_xyz(loc_node, ixyz, new_node) =
          ref_node_xyz(ref_node, ixyz, old);
    }
  }
  RSS(ref_node_initialize_n_global(loc_node, ref_dict_n(node_dict)),
      "init glob");

  ref_cell = ref_grid_tet(ref_grid);
  loc_cell = ref_grid_tet(loc_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  loc_cell = ref_grid_tri(loc_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }

  RSS(ref_dict_location(node_dict, node0, &(nodes[0])), "map0");
  RSS(ref_dict_location(node_dict, node1, &(nodes[1])), "map1");
  printf("node0 %d node1 %d\n", nodes[0], nodes[1]);

  RSS(ref_dict_free(node_dict), "free nodes");

  RSS(ref_export_by_extension(loc_grid, filename), "dump");

  RSS(ref_grid_free(loc_grid), "free loc grid");

  return REF_SUCCESS;
}